

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

Tokens * __thiscall lexer::Lexer::analize(Tokens *__return_storage_ptr__,Lexer *this,string *string)

{
  int iVar1;
  pointer pvVar2;
  long lVar3;
  ulong uVar4;
  runtime_error *this_00;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  string token;
  uint local_b4;
  uint local_b0;
  undefined1 *local_98;
  long local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  Lexer *local_40;
  long local_38;
  
  (__return_storage_ptr__->super__Vector_base<lexer::Token,_std::allocator<lexer::Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<lexer::Token,_std::allocator<lexer::Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<lexer::Token,_std::allocator<lexer::Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98 = &local_88;
  local_90 = 0;
  local_88 = 0;
  local_40 = this;
  if (string->_M_string_length != 0) {
    pcVar10 = (string->_M_dataplus)._M_p;
    uVar7 = 1;
    iVar5 = 0;
    uVar9 = 0;
    local_b0 = 0;
    local_b4 = 1;
    do {
      uVar8 = (ulong)*pcVar10;
      uVar9 = uVar9 + 1;
      if (uVar8 == 10) {
        uVar9 = 0;
      }
      uVar4 = (ulong)iVar5;
      pvVar2 = (local_40->lexerStateMachine).
               super__Vector_base<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(local_40->lexerStateMachine).
                     super__Vector_base<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
              -0x5555555555555555;
      if ((uVar6 < uVar4 || uVar6 - uVar4 == 0) ||
         (lVar3 = *(long *)&pvVar2[uVar4].
                            super__Vector_base<lexer::Transition,_std::allocator<lexer::Transition>_>
                            ._M_impl,
         uVar6 = ((long)*(pointer *)
                         ((long)&pvVar2[uVar4].
                                 super__Vector_base<lexer::Transition,_std::allocator<lexer::Transition>_>
                                 ._M_impl + 8) - lVar3 >> 2) * -0x3333333333333333, uVar4 = uVar8,
         uVar6 < uVar8 || uVar6 - uVar8 == 0)) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4
                  );
LAB_00119994:
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        common::xsnprintf_abi_cxx11_
                  ((string *)local_78,0x40,"invalid char \"%c\" at %d:%d",(ulong)(uint)(int)*pcVar10
                   ,(ulong)uVar7,(ulong)uVar9);
        std::runtime_error::runtime_error(this_00,(string *)local_78);
        *(undefined ***)this_00 = &PTR__runtime_error_00128b38;
        __cxa_throw(this_00,&LexerError::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar5 = *(int *)(lVar3 + uVar8 * 0x14);
      iVar1 = *(int *)(lVar3 + 4 + uVar8 * 0x14);
      local_38 = (long)*(int *)(lVar3 + 0xc + uVar8 * 0x14);
      if ((*(byte *)(lVar3 + 8 + uVar8 * 0x14) & 1) != 0) {
        std::__cxx11::string::push_back((char)&local_98);
      }
      uVar7 = uVar7 + (uVar8 == 10);
      if (iVar5 == 0) {
        if (iVar1 != -2) {
          local_70._M_p = (pointer)&local_60;
          local_78._0_4_ = iVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,local_98,local_98 + local_90);
          local_50 = local_b4;
          local_48 = local_b0;
          local_4c = uVar7;
          local_44 = uVar9;
          std::vector<lexer::Token,_std::allocator<lexer::Token>_>::emplace_back<lexer::Token>
                    (__return_storage_ptr__,(Token *)local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_p != &local_60) {
            operator_delete(local_70._M_p,local_60._0_8_ + 1);
          }
        }
        local_90 = 0;
        *local_98 = 0;
        local_b4 = uVar7;
        local_b0 = uVar9;
      }
      else if (iVar5 == -1) goto LAB_00119994;
      pcVar10 = pcVar10 + local_38;
    } while (pcVar10 != (string->_M_dataplus)._M_p + string->_M_string_length);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Tokens analize(std::string const& string) {
            RuleId currentState = Initial;
            Tokens tokens;
            std::string token;
            int line = 1;
            int column = 0;
            int prevLine = line;
            int prevColumn = column;
            for (std::string::const_iterator c = string.begin(); c != string.end();) {
                if (*c == '\n') {
                    ++line;
                    column = 0;
                } else {
                    ++column;
                }
                Transition transition = lexerStateMachine.
                        at(static_cast<size_t>(currentState)).
                        at(static_cast<size_t>(*c));

                if (transition.putChar)
                    token.push_back(*c);

                if (transition.ruleId == InvalidRule)
                    throw LexerError(common::xsnprintf(64, "invalid char \"%c\" at %d:%d", *c, line, column));
                else {
                    if (transition.ruleId == Initial) {
                        if (transition.tokenId != Skip)
                            tokens.push_back(Token(static_cast<TokenId>(transition.tokenId), token, prevLine, line, prevColumn, column));
                        prevLine = line;
                        prevColumn = column;
                        token.clear();
                    }
                    currentState = transition.ruleId;
                }
                c += transition.increment;
            }
            return tokens;
        }